

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<VCProjectSingleConfig>::emplace<VCProjectSingleConfig_const&>
          (QMovableArrayOps<VCProjectSingleConfig> *this,qsizetype i,VCProjectSingleConfig *args)

{
  VCProjectSingleConfig **ppVVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  VCProjectSingleConfig *pVVar5;
  long in_FS_OFFSET;
  bool bVar6;
  VCProjectSingleConfig tmp;
  VCProjectSingleConfig VStack_3a48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<VCProjectSingleConfig>).
           super_QArrayDataPointer<VCProjectSingleConfig>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0020a13e:
    memset(&VStack_3a48,0xaa,0x3a10);
    VCProjectSingleConfig::VCProjectSingleConfig(&VStack_3a48,args);
    bVar6 = (this->super_QGenericArrayOps<VCProjectSingleConfig>).
            super_QArrayDataPointer<VCProjectSingleConfig>.size != 0;
    QArrayDataPointer<VCProjectSingleConfig>::detachAndGrow
              ((QArrayDataPointer<VCProjectSingleConfig> *)this,(uint)(i == 0 && bVar6),1,
               (VCProjectSingleConfig **)0x0,(QArrayDataPointer<VCProjectSingleConfig> *)0x0);
    pVVar5 = (this->super_QGenericArrayOps<VCProjectSingleConfig>).
             super_QArrayDataPointer<VCProjectSingleConfig>.ptr;
    if (i == 0 && bVar6) {
      VCProjectSingleConfig::VCProjectSingleConfig(pVVar5 + -1,&VStack_3a48);
      ppVVar1 = &(this->super_QGenericArrayOps<VCProjectSingleConfig>).
                 super_QArrayDataPointer<VCProjectSingleConfig>.ptr;
      *ppVVar1 = *ppVVar1 + -1;
    }
    else {
      pVVar5 = pVVar5 + i;
      memmove(pVVar5 + 1,pVVar5,
              ((this->super_QGenericArrayOps<VCProjectSingleConfig>).
               super_QArrayDataPointer<VCProjectSingleConfig>.size - i) * 0x3a10);
      VCProjectSingleConfig::VCProjectSingleConfig(pVVar5,&VStack_3a48);
    }
    pqVar2 = &(this->super_QGenericArrayOps<VCProjectSingleConfig>).
              super_QArrayDataPointer<VCProjectSingleConfig>.size;
    *pqVar2 = *pqVar2 + 1;
    VCProjectSingleConfig::~VCProjectSingleConfig(&VStack_3a48);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<VCProjectSingleConfig>).
            super_QArrayDataPointer<VCProjectSingleConfig>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<VCProjectSingleConfig>).
                      super_QArrayDataPointer<VCProjectSingleConfig>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x47ec28c89c855f9f)) {
      VCProjectSingleConfig::VCProjectSingleConfig
                ((this->super_QGenericArrayOps<VCProjectSingleConfig>).
                 super_QArrayDataPointer<VCProjectSingleConfig>.ptr + lVar4,args);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((VCProjectSingleConfig *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<VCProjectSingleConfig>).
          super_QArrayDataPointer<VCProjectSingleConfig>.ptr)) goto LAB_0020a13e;
      VCProjectSingleConfig::VCProjectSingleConfig
                ((this->super_QGenericArrayOps<VCProjectSingleConfig>).
                 super_QArrayDataPointer<VCProjectSingleConfig>.ptr + -1,args);
      ppVVar1 = &(this->super_QGenericArrayOps<VCProjectSingleConfig>).
                 super_QArrayDataPointer<VCProjectSingleConfig>.ptr;
      *ppVVar1 = *ppVVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<VCProjectSingleConfig>).
              super_QArrayDataPointer<VCProjectSingleConfig>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }